

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphEdit.cpp
# Opt level: O1

QPoint __thiscall GraphEdit::mouseToPlotCoordinates(GraphEdit *this,QPoint mouse)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  
  iVar7 = (this->mPlotRect).x1;
  iVar1 = (this->mPlotRect).x2;
  iVar8 = mouse.xp;
  if (iVar8 < iVar1) {
    uVar4 = 0;
    if (iVar7 <= iVar8) {
      uVar4 = (long)(iVar8 - iVar7) / (long)this->mCellWidth & 0xffffffff;
    }
  }
  else {
    uVar4 = (ulong)(((iVar1 - iVar7) + 1) / this->mCellWidth - 1);
  }
  iVar7 = (this->mPlotRect).y1;
  iVar1 = (this->mPlotRect).y2;
  iVar9 = mouse.yp;
  iVar8 = iVar1 - iVar9;
  if (this->mBarMode == true) {
    if (iVar8 < 0) {
      uVar6 = (ulong)(uint)this->mMinValue;
    }
    else {
      uVar2 = this->mMaxValue;
      uVar6 = (ulong)uVar2;
      if (iVar7 < iVar9) {
        uVar3 = this->mMinValue;
        iVar7 = (iVar1 - iVar7) + 1;
        uVar6 = (long)iVar7 / (long)(int)(uVar2 - uVar3);
        iVar7 = (int)((((int)((int)uVar6 + ((uint)(uVar6 >> 0x1f) & 1)) >> 1) + iVar8) *
                     (uVar2 - uVar3)) / iVar7;
        uVar5 = iVar7 + uVar3;
        if ((int)uVar2 < (int)uVar5) {
          uVar5 = this->mMaxValue;
        }
        if (iVar7 < 0) {
          uVar5 = uVar3;
        }
        uVar6 = (ulong)uVar5;
      }
    }
  }
  else if (iVar8 < 0) {
    uVar6 = 0;
  }
  else {
    if (iVar9 <= iVar7) {
      iVar8 = iVar1 - iVar7;
    }
    uVar6 = (ulong)(uint)(iVar8 / this->mCellHeight);
  }
  return (QPoint)(uVar4 | uVar6 << 0x20);
}

Assistant:

QPoint GraphEdit::mouseToPlotCoordinates(QPoint mouse) {

    int x;
    if (mouse.x() >= mPlotRect.right()) {
        x = (mPlotRect.width() / mCellWidth) - 1;
    } else if (mouse.x() < mPlotRect.left()) {
        x = 0;
    } else {
        x = (mouse.x() - mPlotRect.left()) / mCellWidth;
    }

    auto y = mPlotRect.bottom() - mouse.y();
    bool const belowBottom = y < 0;
    bool const aboveTop = mPlotRect.top() >= mouse.y();
    
    if (mBarMode) {
        if (belowBottom) {
            y = mMinValue;
        } else if (aboveTop) {
            y = mMaxValue;
        } else {
            auto range = mMaxValue - mMinValue;
            y += mPlotRect.height() / range / 2;
            y = y * range / mPlotRect.height() + mMinValue;
            y = std::clamp(y, mMinValue, mMaxValue);
        }
    } else {
        if (belowBottom) {
            y = 0;
        } else if (aboveTop) {
            y = (mPlotRect.height() - 1) / mCellHeight;
        } else {
            y = y / mCellHeight;
        }
    }

    return {x, y};
}